

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O1

void fidentity8x8_new_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  __m256i alVar1;
  
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])*input,(undefined1  [32])*input);
  *output = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])input[1],(undefined1  [32])input[1]);
  output[1] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])input[2],(undefined1  [32])input[2]);
  output[2] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])input[3],(undefined1  [32])input[3]);
  output[3] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])input[4],(undefined1  [32])input[4]);
  output[4] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])input[5],(undefined1  [32])input[5]);
  output[5] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])input[6],(undefined1  [32])input[6]);
  output[6] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])input[7],(undefined1  [32])input[7]);
  output[7] = alVar1;
  return;
}

Assistant:

static inline void fidentity8x8_new_avx2(const __m256i *input, __m256i *output,
                                         int8_t cos_bit) {
  (void)cos_bit;

  output[0] = _mm256_adds_epi16(input[0], input[0]);
  output[1] = _mm256_adds_epi16(input[1], input[1]);
  output[2] = _mm256_adds_epi16(input[2], input[2]);
  output[3] = _mm256_adds_epi16(input[3], input[3]);
  output[4] = _mm256_adds_epi16(input[4], input[4]);
  output[5] = _mm256_adds_epi16(input[5], input[5]);
  output[6] = _mm256_adds_epi16(input[6], input[6]);
  output[7] = _mm256_adds_epi16(input[7], input[7]);
}